

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O2

void Promise::TickAll(void)

{
  bool bVar1;
  __shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
  __first;
  ulong __n;
  shared_ptr<Promise> promise;
  __shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __n = 0;
  while( true ) {
    if ((ulong)((long)entries.
                      super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)entries.
                      super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= __n) break;
    p_Var2 = &std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::at
                        (&entries,__n)->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,p_Var2);
    if (local_30._M_ptr != (Promise *)0x0) {
      bVar1 = IsReadyToExecute(local_30._M_ptr);
      if (bVar1) {
        (**(local_30._M_ptr)->_vptr_Promise)();
      }
      if ((local_30._M_ptr != (Promise *)0x0) && ((local_30._M_ptr)->state != Pending)) {
        std::__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&((local_30._M_ptr)->parent).
                    super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    __n = __n + 1;
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Promise>*,std::vector<std::shared_ptr<Promise>,std::allocator<std::shared_ptr<Promise>>>>,__gnu_cxx::__ops::_Iter_pred<Promise::TickAll()::_lambda(std::shared_ptr<Promise>const&)_1_>>
                      ();
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::erase
            (&entries,(const_iterator)__first._M_current,
             (const_iterator)
             entries.
             super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

static void TickAll() {
    for (size_t i = 0; i < entries.size(); i++) { // NOLINT(modernize-loop-convert)
      PromisePtr promise = entries.at(i);
      if (!promise) continue;
      if (promise->IsReadyToExecute()) {
        promise->Tick();
      }

      if (promise && promise->IsDone()) {
        promise->parent.reset();
      }
    }

    const auto size = entries.size();
    const auto it = std::remove_if(entries.begin(), entries.end(),
                                   [](const PromisePtr& promise) {
                                     return !promise || promise->IsDone();
                                   });
    entries.erase(it, entries.end());

    if (size != entries.size()) {
      DEBUG("Cleaned up the vector: %u -> %u\n", size, entries.size());
    }
  }